

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

void __thiscall
vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
prepare_next_dimension
          (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *this,
          int dimension)

{
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *prVar1;
  
  prVar1 = this->comparator;
  if (prVar1 != (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                 *)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&(prVar1->vertices).super__Vector_base<int,_std::allocator<int>_>);
    operator_delete(prVar1,0x30);
  }
  prVar1 = (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
           operator_new(0x30);
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  rips_filtration_comparator(prVar1,this->distance_matrix,dimension,&this->binomial_coeff);
  this->comparator = prVar1;
  prVar1 = this->next_comparator;
  if (prVar1 != (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                 *)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&(prVar1->vertices).super__Vector_base<int,_std::allocator<int>_>);
    operator_delete(prVar1,0x30);
  }
  prVar1 = (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
           operator_new(0x30);
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  rips_filtration_comparator(prVar1,this->distance_matrix,dimension + 1,&this->binomial_coeff);
  this->next_comparator = prVar1;
  if (0 < dimension) {
    this->current_dimension = this->current_dimension + 1;
  }
  return;
}

Assistant:

void prepare_next_dimension(int dimension) {
		if (comparator != nullptr) delete comparator;
		comparator = new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension, binomial_coeff);

		if (next_comparator != nullptr) delete next_comparator;
		next_comparator =
		    new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension + 1, binomial_coeff);

		if (dimension > 0) current_dimension++;
	}